

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ParamAssignmentSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((kind == NamedParamAssignment) || (kind == OrderedParamAssignment)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ParamAssignmentSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::NamedParamAssignment:
        case SyntaxKind::OrderedParamAssignment:
            return true;
        default:
            return false;
    }
}